

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_log.cpp
# Opt level: O0

void __thiscall cubeb_async_logger::run(cubeb_async_logger *this)

{
  thread *in_RDI;
  thread *unaff_retaddr;
  thread *in_stack_ffffffffffffffd8;
  
  std::thread::thread<cubeb_async_logger::run()::_lambda()_1_,,void>(unaff_retaddr,(type *)in_RDI);
  std::thread::operator=(in_RDI,in_stack_ffffffffffffffd8);
  std::thread::~thread((thread *)0x1114c4);
  return;
}

Assistant:

void run()
  {
    assert(logging_thread.get_id() == std::thread::id());
    logging_thread = std::thread([this]() {
      CUBEB_REGISTER_THREAD("cubeb_log");
      while (!shutdown_thread) {
        cubeb_log_message msg;
        while (msg_queue_consumer.load()->dequeue(&msg, 1)) {
          cubeb_log_internal_no_format(msg.get());
        }
        std::this_thread::sleep_for(
            std::chrono::milliseconds(CUBEB_LOG_BATCH_PRINT_INTERVAL_MS));
      }
      CUBEB_UNREGISTER_THREAD();
    });
  }